

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall
ON_MeshComponentRef::GetBBox(ON_MeshComponentRef *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ON_Mesh *this_00;
  ON_MeshTopologyEdge *pOVar4;
  ON_MeshTopologyVertex *pOVar5;
  uint *puVar6;
  ON_MeshFace *pOVar7;
  undefined1 auVar8 [16];
  double dVar9;
  uint uVar10;
  bool bVar11;
  ON_MeshNgon *pOVar12;
  ON_MeshTopology *pOVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  ON_3dPoint *this_01;
  ulong uVar19;
  uint uVar20;
  ON_MeshFace *pOVar21;
  uint vdex_buffer [2];
  ON_3dPointListRef vertex_list;
  ON_3dPoint v [16];
  
  this_00 = this->m_mesh;
  if (this_00 == (ON_Mesh *)0x0) {
    return false;
  }
  switch((this->m_mesh_ci).m_type) {
  case mesh_vertex:
    vdex_buffer[0] = (this->m_mesh_ci).m_index;
    break;
  case meshtop_vertex:
    if ((this->m_mesh_ci).m_index < 0) {
      return false;
    }
    pOVar13 = MeshTopology(this);
    if (pOVar13 == (ON_MeshTopology *)0x0) {
      return false;
    }
    iVar3 = (this->m_mesh_ci).m_index;
    if ((pOVar13->m_topv).m_count <= iVar3) {
      return false;
    }
    pOVar5 = (pOVar13->m_topv).m_a;
    if (pOVar5[iVar3].m_v_count < 1) {
      return false;
    }
    puVar6 = (uint *)pOVar5[iVar3].m_vi;
    if (puVar6 == (uint *)0x0) {
      return false;
    }
    vdex_buffer[0] = *puVar6;
    break;
  case meshtop_edge:
    if ((this->m_mesh_ci).m_index < 0) {
      return false;
    }
    pOVar13 = MeshTopology(this);
    if (pOVar13 == (ON_MeshTopology *)0x0) {
      return false;
    }
    iVar3 = (this->m_mesh_ci).m_index;
    if ((pOVar13->m_tope).m_count <= iVar3) {
      return false;
    }
    pOVar4 = (pOVar13->m_tope).m_a;
    lVar14 = 0;
    uVar18 = 0;
    bVar16 = true;
    do {
      bVar11 = bVar16;
      iVar2 = pOVar4[iVar3].m_topvi[lVar14];
      lVar14 = (long)iVar2;
      uVar19 = uVar18;
      if ((((-1 < lVar14) && (iVar2 < (pOVar13->m_topv).m_count)) &&
          (pOVar5 = (pOVar13->m_topv).m_a, 0 < pOVar5[lVar14].m_v_count)) &&
         ((puVar6 = (uint *)pOVar5[lVar14].m_vi, puVar6 != (uint *)0x0 &&
          (uVar17 = *puVar6, -1 < (int)uVar17)))) {
        uVar19 = (ulong)((int)uVar18 + 1);
        vdex_buffer[uVar18] = uVar17;
      }
      lVar14 = 1;
      uVar18 = uVar19;
      uVar10 = (uint)uVar19;
      bVar16 = false;
    } while (bVar11);
    goto LAB_0050eeb0;
  case mesh_face:
    iVar3 = (this->m_mesh_ci).m_index;
    lVar14 = (long)iVar3;
    if (lVar14 < 0) {
      return false;
    }
    if ((this_00->m_F).m_count <= iVar3) {
      return false;
    }
    pOVar7 = (this_00->m_F).m_a;
    pOVar21 = pOVar7 + lVar14;
    uVar17 = (pOVar7[lVar14].vi[2] != pOVar7[lVar14].vi[3]) + 3;
    goto LAB_0050eefc;
  case mesh_ngon:
    pOVar12 = ON_Mesh::Ngon(this_00,(this->m_mesh_ci).m_index);
    if (pOVar12 == (ON_MeshNgon *)0x0) {
      return false;
    }
    uVar17 = pOVar12->m_Vcount;
    if (uVar17 == 0) {
      return false;
    }
    pOVar21 = (ON_MeshFace *)pOVar12->m_vi;
    uVar10 = 0;
    if (pOVar21 != (ON_MeshFace *)0x0) goto LAB_0050eefc;
LAB_0050eeb0:
    uVar17 = uVar10;
    if (uVar17 != 0) {
      pOVar21 = (ON_MeshFace *)vdex_buffer;
      goto LAB_0050eefc;
    }
  default:
    goto LAB_0050f0b7;
  }
  if (-1 < (int)vdex_buffer[0]) {
    pOVar21 = (ON_MeshFace *)vdex_buffer;
    uVar17 = 1;
LAB_0050eefc:
    ON_3dPointListRef::ON_3dPointListRef(&vertex_list,this->m_mesh);
    uVar10 = vertex_list.m_point_count;
    uVar18 = 0;
    uVar19 = 0;
    bVar16 = false;
    do {
      uVar20 = pOVar21->vi[uVar18];
      if (uVar20 < uVar10) {
        this_01 = v + uVar19;
        if (uVar20 < vertex_list.m_point_count) {
          if (vertex_list.m_dP == (double *)0x0) {
            dVar1 = (double)(float)*(undefined8 *)
                                    (vertex_list.m_fP + uVar20 * vertex_list.m_point_stride);
            dVar9 = (double)(float)((ulong)*(undefined8 *)
                                            (vertex_list.m_fP + uVar20 * vertex_list.m_point_stride)
                                   >> 0x20);
            auVar8._8_4_ = SUB84(dVar9,0);
            auVar8._0_8_ = dVar1;
            auVar8._12_4_ = (int)((ulong)dVar9 >> 0x20);
            this_01->x = dVar1;
            this_01->y = (double)auVar8._8_8_;
            dVar1 = (double)vertex_list.m_fP[(ulong)(uVar20 * vertex_list.m_point_stride) + 2];
          }
          else {
            uVar15 = (ulong)(uVar20 * vertex_list.m_point_stride);
            this_01->x = vertex_list.m_dP[uVar15];
            v[uVar19].y = vertex_list.m_dP[uVar15 + 1];
            dVar1 = vertex_list.m_dP[uVar15 + 2];
          }
          v[uVar19].z = dVar1;
        }
        else {
          v[uVar19].z = -1.23432101234321e+308;
          this_01->x = -1.23432101234321e+308;
          v[uVar19].y = -1.23432101234321e+308;
        }
        bVar11 = ON_3dPoint::IsValid(this_01);
        if ((bVar11) && (uVar20 = (int)uVar19 + 1, uVar19 = (ulong)uVar20, uVar20 == 0x10)) {
          uVar19 = 0;
          bVar11 = ON_GetPointListBoundingBox
                             (3,false,0x10,3,&v[0].x,boxmin,boxmax,(uint)(bGrowBox & 1));
          bVar16 = (bool)(bVar16 | bVar11);
          if (bVar11) {
            bGrowBox = true;
          }
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar17 != uVar18);
    if ((int)uVar19 != 0) {
      bVar11 = ON_GetPointListBoundingBox
                         (3,false,(int)uVar19,3,&v[0].x,boxmin,boxmax,(uint)(bGrowBox & 1));
      return (bool)(bVar11 | bVar16);
    }
    return bVar16;
  }
LAB_0050f0b7:
  return false;
}

Assistant:

bool ON_MeshComponentRef::GetBBox(
       double* boxmin,
       double* boxmax,
       bool bGrowBox
       ) const
{
  const unsigned int* vdex_list = 0;
  unsigned int vdex_count = 0;
  unsigned int vdex_buffer[2];

  if ( 0 == m_mesh )
    return false;

  switch(m_mesh_ci.m_type)
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
    if (m_mesh_ci.m_index >= 0)
      vdex_buffer[vdex_count++] = (unsigned int)m_mesh_ci.m_index;
    break;

  case ON_COMPONENT_INDEX::meshtop_vertex:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_topv.Count())
      {
        const ON_MeshTopologyVertex& v = top->m_topv[m_mesh_ci.m_index];
        if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
          vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
      }
    }
    break;

  case ON_COMPONENT_INDEX::meshtop_edge:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_tope.Count())
      {
        const ON_MeshTopologyEdge& e = top->m_tope[m_mesh_ci.m_index];
        for ( unsigned int j = 0; j < 2; j++ )
        {
          if ( e.m_topvi[j] >= 0 && e.m_topvi[j] < top->m_topv.Count() )
          {
            const ON_MeshTopologyVertex& v = top->m_topv[e.m_topvi[j]];
            if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
            {
              vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
            }
          }
        }
      }
    }
    break;

  case ON_COMPONENT_INDEX::mesh_face:
    if (m_mesh_ci.m_index >= 0 && m_mesh_ci.m_index < m_mesh->m_F.Count())
    {
      vdex_list = (const unsigned int*)(m_mesh->m_F[m_mesh_ci.m_index].vi);
      vdex_count = (vdex_list[2] == vdex_list[3]) ? 3 : 4;
    }
    break;

  case ON_COMPONENT_INDEX::mesh_ngon:
    {
      const ON_MeshNgon* ngon = m_mesh->Ngon(m_mesh_ci.m_index);
      if ( ngon && ngon->m_Vcount > 0 && 0 != ngon->m_vi )
      {
        vdex_list = ngon->m_vi;
        vdex_count = ngon->m_Vcount;
      }
    }
    break;

  default:
    break;
  }

  if ( 0 == vdex_list )
  {
    if ( 0 == vdex_count )
      return 0;
    vdex_list = vdex_buffer;
  }

  bool rc = false;
  const ON_3dPointListRef vertex_list(m_mesh);
  const unsigned int vertex_count = vertex_list.PointCount();
  ON_3dPoint v[16];
  const unsigned int v_capacity = (unsigned int)(sizeof(v)/sizeof(v[0]));
  unsigned int v_count = 0;
  for ( unsigned int i = 0; i < vdex_count; i++ )
  {
    if ( vdex_list[i] < vertex_count )
    {
      vertex_list.GetPoint(vdex_list[i],&v[v_count].x);
      if ( v[v_count].IsValid() )
      {
        v_count++;
        if ( v_capacity == v_count )
        {
          if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
          {
            bGrowBox = true;
            rc = true;
          }
          v_count = 0;
        }
      }
    }
  }

  if ( v_count > 0 )
  {
    if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
      rc = true;
    v_count = 0;
  }

  return rc;
}